

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_lines.c
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  ALLEGRO_EVENT_QUEUE *pAVar5;
  undefined8 uVar6;
  long in_RSI;
  int in_EDI;
  undefined8 uVar7;
  _Bool blend;
  ALLEGRO_KEYBOARD_STATE kst;
  ALLEGRO_EVENT event;
  undefined1 in_stack_ffffffffffffff2f;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int x;
  float fStack_98;
  undefined1 local_80 [40];
  int local_58 [8];
  int local_38;
  int local_18;
  
  uVar4 = al_install_system(0x5020700,atexit);
  if ((uVar4 & 1) == 0) {
    abort_example("Could not init Allegro.\n");
  }
  al_init_primitives_addon();
  al_install_keyboard();
  al_install_mouse();
  display = (ALLEGRO_DISPLAY *)al_create_display(0x280,0x1e0);
  if (display == (ALLEGRO_DISPLAY *)0x0) {
    abort_example("Error creating display\n");
  }
  uVar6 = 0;
  uVar7 = al_map_rgb_f(0);
  black.b = (float)(int)uVar6;
  black.a = (float)(int)((ulong)uVar6 >> 0x20);
  black.r = (float)(int)uVar7;
  black.g = (float)(int)((ulong)uVar7 >> 0x20);
  uVar6 = 0x3f800000;
  uVar7 = al_map_rgb_f(0x3f800000);
  x = (int)uVar6;
  fStack_98 = (float)((ulong)uVar6 >> 0x20);
  white.b = (float)x;
  white.r = (float)(int)uVar7;
  white.g = (float)(int)((ulong)uVar7 >> 0x20);
  white.a = fStack_98;
  uVar6._0_4_ = 0.5;
  uVar6._4_4_ = 0.0;
  background._0_8_ = al_map_rgb_f(0x3f000000,0x3f000000,0x3f19999a);
  background._8_8_ = uVar6;
  if ((1 < in_EDI) && (iVar3 = strcmp(*(char **)(in_RSI + 8),"--memory-bitmap"), iVar3 == 0)) {
    al_set_new_bitmap_flags(1);
  }
  dbuf = (ALLEGRO_BITMAP *)al_create_bitmap(0x280,0x1e0);
  if (dbuf == (ALLEGRO_BITMAP *)0x0) {
    abort_example("Error creating double buffer\n");
  }
  al_set_target_bitmap(dbuf);
  al_clear_to_color(background.r,background._8_8_);
  draw_clip_rect();
  flip();
  pAVar5 = (ALLEGRO_EVENT_QUEUE *)al_create_event_queue();
  queue = pAVar5;
  uVar6 = al_get_keyboard_event_source();
  al_register_event_source(pAVar5,uVar6);
  pAVar5 = queue;
  uVar6 = al_get_mouse_event_source();
  al_register_event_source(pAVar5,uVar6);
  do {
    while( true ) {
      while (al_wait_for_event(queue,local_58), local_58[0] == 0x15) {
        al_get_keyboard_state(local_80);
        bVar1 = al_key_down(local_80,0xd7);
        in_stack_ffffffffffffff34 = CONCAT13(1,(int3)in_stack_ffffffffffffff34);
        if ((bVar1 & 1) == 0) {
          uVar2 = al_key_down(local_80,0xd8);
          in_stack_ffffffffffffff34 = CONCAT13(uVar2,(int3)in_stack_ffffffffffffff34);
        }
        if (local_18 == 1) {
          plonk(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30,(_Bool)in_stack_ffffffffffffff2f
               );
        }
        else {
          splat(x,(int)((ulong)uVar7 >> 0x20),SUB81((ulong)uVar7 >> 0x18,0));
        }
      }
      if (local_58[0] != 0x2e) break;
      last_y = -1;
      last_x = -1;
    }
  } while ((local_58[0] != 10) || (local_38 != 0x3b));
  al_destroy_event_queue(queue);
  al_destroy_bitmap(dbuf);
  return 0;
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_EVENT event;
   ALLEGRO_KEYBOARD_STATE kst;
   bool blend;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }

   al_init_primitives_addon();
   al_install_keyboard();
   al_install_mouse();

   display = al_create_display(W, H);
   if (!display) {
      abort_example("Error creating display\n");
   }

   black = al_map_rgb_f(0.0, 0.0, 0.0);
   white = al_map_rgb_f(1.0, 1.0, 1.0);
   background = al_map_rgb_f(0.5, 0.5, 0.6);

   if (argc > 1 && 0 == strcmp(argv[1], "--memory-bitmap")) {
      al_set_new_bitmap_flags(ALLEGRO_MEMORY_BITMAP);
   }
   dbuf = al_create_bitmap(W, H);
   if (!dbuf) {
      abort_example("Error creating double buffer\n");
   }

   al_set_target_bitmap(dbuf);
   al_clear_to_color(background);
   draw_clip_rect();
   flip();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());

   while (true) {
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         al_get_keyboard_state(&kst);
         blend = al_key_down(&kst, ALLEGRO_KEY_LSHIFT) ||
            al_key_down(&kst, ALLEGRO_KEY_RSHIFT);
         if (event.mouse.button == 1) {
            plonk(event.mouse.x, event.mouse.y, blend);
         } else {
            splat(event.mouse.x, event.mouse.y, blend);
         }
      }
      else if (event.type == ALLEGRO_EVENT_DISPLAY_SWITCH_OUT) {
         last_x = last_y = -1;
      }
      else if (event.type == ALLEGRO_EVENT_KEY_DOWN &&
         event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
      {
         break;
      }
   }

   al_destroy_event_queue(queue);
   al_destroy_bitmap(dbuf);

   return 0;
}